

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::MultiThreadedTest::iterate(MultiThreadedTest *this)

{
  int iVar1;
  ulong uVar2;
  ThreadStatus TVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  TestThread *this_00;
  deUint64 dVar6;
  size_type sVar7;
  reference ppTVar8;
  reference pvVar9;
  ThreadLog *pTVar10;
  vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_> *pvVar11;
  const_reference pvVar12;
  unsigned_long local_858;
  MessageBuilder local_850;
  unsigned_long local_6d0;
  MessageBuilder local_6c8;
  unsigned_long local_548;
  MessageBuilder local_540;
  int local_3bc;
  deUint64 dStack_3b8;
  int threadNdx_7;
  deUint64 nextThreadTimeUs_1;
  int nextThreadNdx_1;
  vector<int,_std::allocator<int>_> messageNdx_1;
  deUint64 currentTimeUs;
  unsigned_long uStack_380;
  int threadNdx_6;
  MessageBuilder local_378;
  int local_1f4;
  deUint64 dStack_1f0;
  int threadNdx_5;
  deUint64 nextThreadTimeUs;
  int nextThreadNdx;
  vector<int,_std::allocator<int>_> messageNdx;
  int threadNdx_4;
  bool notSupported;
  int iStack_1bc;
  bool isOk;
  int threadNdx_3;
  int threadNdx_2;
  int readyCount;
  int threadNdx_1;
  int local_1a8;
  int threadNdx;
  MessageBuilder local_198;
  MultiThreadedTest *local_18;
  MultiThreadedTest *this_local;
  
  local_18 = this;
  if ((this->m_initialized & 1U) == 0) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_198,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [23])"Thread timeout limit: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_timeoutUs);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2b91819);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::reserve
              (&this->m_threads,(long)this->m_threadCount);
    for (local_1a8 = 0; local_1a8 < this->m_threadCount; local_1a8 = local_1a8 + 1) {
      this_00 = (TestThread *)operator_new(0x1b8);
      TestThread::TestThread(this_00,this,local_1a8);
      _readyCount = this_00;
      std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::push_back
                (&this->m_threads,(value_type *)&readyCount);
    }
    dVar6 = deGetMicroseconds();
    this->m_startTimeUs = dVar6;
    for (threadNdx_2 = 0;
        sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::size
                          (&this->m_threads), threadNdx_2 < (int)sVar7;
        threadNdx_2 = threadNdx_2 + 1) {
      ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                operator[](&this->m_threads,(long)threadNdx_2);
      de::Thread::start(&(*ppTVar8)->super_Thread);
    }
    this->m_initialized = true;
  }
  threadNdx_3 = 0;
  for (iStack_1bc = 0;
      sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::size
                        (&this->m_threads), iStack_1bc < (int)sVar7; iStack_1bc = iStack_1bc + 1) {
    ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
              operator[](&this->m_threads,(long)iStack_1bc);
    TVar3 = TestThread::getStatus(*ppTVar8);
    if (TVar3 != THREADSTATUS_RUNNING) {
      threadNdx_3 = threadNdx_3 + 1;
    }
  }
  if (threadNdx_3 == this->m_threadCount) {
    for (threadNdx_4 = 0;
        sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::size
                          (&this->m_threads), threadNdx_4 < (int)sVar7;
        threadNdx_4 = threadNdx_4 + 1) {
      ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                operator[](&this->m_threads,(long)threadNdx_4);
      de::Thread::join(&(*ppTVar8)->super_Thread);
    }
    messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._6_1_ = 0;
    for (messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        iVar1 = (int)messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
        sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::size
                          (&this->m_threads), iVar1 < (int)sVar7;
        messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                operator[](&this->m_threads,
                           (long)(int)messageNdx.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      TVar3 = TestThread::getStatus(*ppTVar8);
      if (TVar3 == THREADSTATUS_ERROR) {
        messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ = 0;
      }
      ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                operator[](&this->m_threads,
                           (long)(int)messageNdx.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      TVar3 = TestThread::getStatus(*ppTVar8);
      if (TVar3 == THREADSTATUS_NOT_SUPPORTED) {
        messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._6_1_ = 1;
      }
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&nextThreadNdx);
    sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::size
                      (&this->m_threads);
    nextThreadTimeUs._4_4_ = 0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&nextThreadNdx,sVar7,
               (value_type_conflict1 *)((long)&nextThreadTimeUs + 4));
    do {
      nextThreadTimeUs._0_4_ = -1;
      dStack_1f0 = 0;
      for (local_1f4 = 0; iVar1 = local_1f4,
          sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                  size(&this->m_threads), iVar1 < (int)sVar7; local_1f4 = local_1f4 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&nextThreadNdx,(long)local_1f4);
        iVar1 = *pvVar9;
        ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                  operator[](&this->m_threads,(long)local_1f4);
        pTVar10 = TestThread::getLog(*ppTVar8);
        pvVar11 = ThreadLog::getMessages(pTVar10);
        sVar7 = std::
                vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                ::size(pvVar11);
        uVar2 = dStack_1f0;
        if (iVar1 < (int)sVar7) {
          if ((int)nextThreadTimeUs != -1) {
            ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                      ::operator[](&this->m_threads,(long)local_1f4);
            pTVar10 = TestThread::getLog(*ppTVar8);
            pvVar11 = ThreadLog::getMessages(pTVar10);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&nextThreadNdx,(long)local_1f4)
            ;
            pvVar12 = std::
                      vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                      ::operator[](pvVar11,(long)*pvVar9);
            if (uVar2 <= pvVar12->timeUs) goto LAB_0177825b;
          }
          nextThreadTimeUs._0_4_ = local_1f4;
          ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                    operator[](&this->m_threads,(long)local_1f4);
          pTVar10 = TestThread::getLog(*ppTVar8);
          pvVar11 = ThreadLog::getMessages(pTVar10);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&nextThreadNdx,(long)local_1f4);
          pvVar12 = std::
                    vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                    ::operator[](pvVar11,(long)*pvVar9);
          dStack_1f0 = pvVar12->timeUs;
        }
LAB_0177825b:
      }
      if ((int)nextThreadTimeUs == -1) {
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)&nextThreadNdx);
        for (currentTimeUs._4_4_ = 0;
            sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                    size(&this->m_threads), currentTimeUs._4_4_ < (int)sVar7;
            currentTimeUs._4_4_ = currentTimeUs._4_4_ + 1) {
          ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                    operator[](&this->m_threads,(long)currentTimeUs._4_4_);
          if (*ppTVar8 != (value_type)0x0) {
            (*((*ppTVar8)->super_Thread)._vptr_Thread[1])();
          }
        }
        std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::clear
                  (&this->m_threads);
        if ((messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
        }
        else if ((messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
        }
        return STOP;
      }
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_378,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_378,(char (*) [2])0x2c3fdfc);
      uStack_380 = dStack_1f0 - this->m_startTimeUs;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xfffffffffffffc80);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"] (");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&nextThreadTimeUs);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2b56371);
      ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                operator[](&this->m_threads,(long)(int)nextThreadTimeUs);
      pTVar10 = TestThread::getLog(*ppTVar8);
      pvVar11 = ThreadLog::getMessages(pTVar10);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&nextThreadNdx,
                          (long)(int)nextThreadTimeUs);
      pvVar12 = std::
                vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                ::operator[](pvVar11,(long)*pvVar9);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvVar12->msg);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_378);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&nextThreadNdx,
                          (long)(int)nextThreadTimeUs);
      *pvVar9 = *pvVar9 + 1;
    } while( true );
  }
  messageNdx_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)deGetMicroseconds();
  if ((long)messageNdx_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage - this->m_startTimeUs <= this->m_timeoutUs) {
    deSleep(10);
    return CONTINUE;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&nextThreadNdx_1);
  sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::size
                    (&this->m_threads);
  nextThreadTimeUs_1._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&nextThreadNdx_1,sVar7,
             (value_type_conflict1 *)((long)&nextThreadTimeUs_1 + 4));
  do {
    nextThreadTimeUs_1._0_4_ = -1;
    dStack_3b8 = 0;
    for (local_3bc = 0; iVar1 = local_3bc,
        sVar7 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::size
                          (&this->m_threads), iVar1 < (int)sVar7; local_3bc = local_3bc + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&nextThreadNdx_1,(long)local_3bc);
      iVar1 = *pvVar9;
      ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                operator[](&this->m_threads,(long)local_3bc);
      pTVar10 = TestThread::getLog(*ppTVar8);
      pvVar11 = ThreadLog::getMessages(pTVar10);
      sVar7 = std::
              vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
              ::size(pvVar11);
      uVar2 = dStack_3b8;
      if (iVar1 < (int)sVar7) {
        if ((int)nextThreadTimeUs_1 != -1) {
          ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                    operator[](&this->m_threads,(long)local_3bc);
          pTVar10 = TestThread::getLog(*ppTVar8);
          pvVar11 = ThreadLog::getMessages(pTVar10);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&nextThreadNdx_1,(long)local_3bc)
          ;
          pvVar12 = std::
                    vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                    ::operator[](pvVar11,(long)*pvVar9);
          if (uVar2 <= pvVar12->timeUs) goto LAB_017787bc;
        }
        nextThreadTimeUs_1._0_4_ = local_3bc;
        ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
                  operator[](&this->m_threads,(long)local_3bc);
        pTVar10 = TestThread::getLog(*ppTVar8);
        pvVar11 = ThreadLog::getMessages(pTVar10);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&nextThreadNdx_1,(long)local_3bc);
        pvVar12 = std::
                  vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                  ::operator[](pvVar11,(long)*pvVar9);
        dStack_3b8 = pvVar12->timeUs;
      }
LAB_017787bc:
    }
    if ((int)nextThreadTimeUs_1 == -1) {
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&nextThreadNdx_1);
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_6c8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_6c8,(char (*) [2])0x2c3fdfc);
      local_6d0 = (long)messageNdx_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage - this->m_startTimeUs;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6d0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [23])"] (-) Timeout, Limit: ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_timeoutUs);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2b91819);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6c8);
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_850,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_850,(char (*) [2])0x2c3fdfc);
      local_858 = (long)messageNdx_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage - this->m_startTimeUs;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_858);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [44])"] (-) Trying to perform resource cleanup...");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_850);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
      return STOP;
    }
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_540,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_540,(char (*) [2])0x2c3fdfc);
    local_548 = dStack_3b8 - this->m_startTimeUs;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_548);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"] (");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&nextThreadTimeUs_1);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2b56371);
    ppTVar8 = std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::
              operator[](&this->m_threads,(long)(int)nextThreadTimeUs_1);
    pTVar10 = TestThread::getLog(*ppTVar8);
    pvVar11 = ThreadLog::getMessages(pTVar10);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&nextThreadNdx_1,
                        (long)(int)nextThreadTimeUs_1);
    pvVar12 = std::
              vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
              ::operator[](pvVar11,(long)*pvVar9);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvVar12->msg);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_540);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&nextThreadNdx_1,
                        (long)(int)nextThreadTimeUs_1);
    *pvVar9 = *pvVar9 + 1;
  } while( true );
}

Assistant:

TestCase::IterateResult MultiThreadedTest::iterate (void)
{
	if (!m_initialized)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Thread timeout limit: " << m_timeoutUs << "us" << tcu::TestLog::EndMessage;

		// Create threads
		m_threads.reserve(m_threadCount);

		for (int threadNdx = 0; threadNdx < m_threadCount; threadNdx++)
			m_threads.push_back(new TestThread(*this, threadNdx));

		m_startTimeUs = deGetMicroseconds();

		// Run threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->start();

		m_initialized = true;
	}

	int readyCount = 0;
	for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
	{
		if (m_threads[threadNdx]->getStatus() != TestThread::THREADSTATUS_RUNNING)
			readyCount++;
	}

	if (readyCount == m_threadCount)
	{
		// Join threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->join();

		bool isOk			= true;
		bool notSupported	= false;

		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			if (m_threads[threadNdx]->getStatus() == TestThread::THREADSTATUS_ERROR)
				isOk = false;

			if (m_threads[threadNdx]->getStatus() == TestThread::THREADSTATUS_NOT_SUPPORTED)
				notSupported = true;
		}

		// Get logs
		{
			vector<int> messageNdx;

			messageNdx.resize(m_threads.size(), 0);

			while (true)
			{
				int			nextThreadNdx		= -1;
				deUint64	nextThreadTimeUs	= 0;

				for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
				{
					if (messageNdx[threadNdx] >= (int)m_threads[threadNdx]->getLog().getMessages().size())
						continue;

					if (nextThreadNdx == -1 || nextThreadTimeUs > m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs)
					{
						nextThreadNdx		= threadNdx;
						nextThreadTimeUs	= m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs;
					}
				}

				if (nextThreadNdx == -1)
					break;

				m_testCtx.getLog() << tcu::TestLog::Message << "[" << (nextThreadTimeUs - m_startTimeUs) << "] (" << nextThreadNdx << ") " << m_threads[nextThreadNdx]->getLog().getMessages()[messageNdx[nextThreadNdx]].msg << tcu::TestLog::EndMessage;

				messageNdx[nextThreadNdx]++;
			}
		}

		// Destroy threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			delete m_threads[threadNdx];

		m_threads.clear();

		// Set result
		if (isOk)
		{
			if (notSupported)
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}
	else
	{
		// Check for timeout
		const deUint64 currentTimeUs = deGetMicroseconds();

		if (currentTimeUs - m_startTimeUs > m_timeoutUs)
		{
			// Get logs
			{
				vector<int> messageNdx;

				messageNdx.resize(m_threads.size(), 0);

				while (true)
				{
					int			nextThreadNdx		= -1;
					deUint64	nextThreadTimeUs	= 0;

					for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
					{
						if (messageNdx[threadNdx] >= (int)m_threads[threadNdx]->getLog().getMessages().size())
							continue;

						if (nextThreadNdx == -1 || nextThreadTimeUs > m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs)
						{
							nextThreadNdx		= threadNdx;
							nextThreadTimeUs	= m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs;
						}
					}

					if (nextThreadNdx == -1)
						break;

					m_testCtx.getLog() << tcu::TestLog::Message << "[" << (nextThreadTimeUs - m_startTimeUs) << "] (" << nextThreadNdx << ") " << m_threads[nextThreadNdx]->getLog().getMessages()[messageNdx[nextThreadNdx]].msg << tcu::TestLog::EndMessage;

					messageNdx[nextThreadNdx]++;
				}
			}

			m_testCtx.getLog() << tcu::TestLog::Message << "[" << (currentTimeUs - m_startTimeUs) << "] (-) Timeout, Limit: " << m_timeoutUs << "us" << tcu::TestLog::EndMessage;
			m_testCtx.getLog() << tcu::TestLog::Message << "[" << (currentTimeUs - m_startTimeUs) << "] (-) Trying to perform resource cleanup..." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		// Sleep
		deSleep(10);
	}

	return CONTINUE;
}